

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O3

void __thiscall trng::yarn3s::split(yarn3s *this,uint s,uint n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint i_5;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int32_t iVar12;
  int32_t iVar13;
  uint i;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  int32_t b [9];
  int32_t a [3];
  int local_68;
  uint local_64;
  uint local_60;
  int32_t local_5c;
  int local_58;
  uint local_54;
  int32_t local_50;
  int32_t local_4c;
  int local_48;
  int32_t local_40;
  int32_t iStack_3c;
  int local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_68,"invalid argument for trng::yarn3s::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_68);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_68);
  }
  if (1 < s) {
    uVar3 = (ulong)n + 1;
    if (n < 0xf) {
      uVar14 = (this->S).r[0];
      uVar15 = (this->S).r[1];
      uVar4 = (this->S).r[2];
      do {
        uVar7 = uVar15;
        uVar15 = uVar14;
        uVar6 = (long)(int)uVar4 * (long)(this->P).a[2] + (long)(int)uVar7 * (long)(this->P).a[1] +
                (long)(int)uVar15 * (long)(this->P).a[0];
        uVar6 = (uVar6 >> 0x1f) * -0x7fffadb3 + uVar6;
        uVar6 = (uVar6 >> 0x1f) * -0x7fffadb3 + uVar6;
        uVar4 = (uint)uVar6;
        uVar14 = uVar4 + 0x8000524d;
        if (uVar6 < 0x7fffadb3) {
          uVar14 = uVar4;
        }
        uVar1 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar1;
        uVar4 = uVar7;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar14;
      (this->S).r[1] = uVar15;
      (this->S).r[2] = uVar7;
    }
    else {
      uVar14 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar16 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar16);
      uVar14 = (this->S).r[0];
    }
    uVar3 = (ulong)s;
    if (s < 0x10) {
      uVar15 = uVar14;
      uVar4 = (this->S).r[1];
      uVar7 = (this->S).r[2];
      uVar1 = s;
      do {
        uVar10 = uVar4;
        uVar4 = uVar15;
        uVar6 = (long)(int)uVar7 * (long)(this->P).a[2] + (long)(int)uVar10 * (long)(this->P).a[1] +
                (long)(int)uVar4 * (long)(this->P).a[0];
        uVar6 = (uVar6 >> 0x1f) * -0x7fffadb3 + uVar6;
        uVar6 = (uVar6 >> 0x1f) * -0x7fffadb3 + uVar6;
        uVar7 = (uint)uVar6;
        uVar15 = uVar7 + 0x8000524d;
        if (uVar6 < 0x7fffadb3) {
          uVar15 = uVar7;
        }
        uVar1 = uVar1 - 1;
        uVar7 = uVar10;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar15;
      (this->S).r[1] = uVar4;
      (this->S).r[2] = uVar10;
    }
    else {
      uVar15 = 0;
      uVar6 = uVar3;
      do {
        if ((uVar6 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar16 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar16);
      uVar15 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar6 = (ulong)uVar15;
      iVar2 = (this->S).r[1];
      iVar5 = (this->S).r[2];
      uVar4 = s;
      do {
        iVar8 = iVar2;
        iVar2 = (int)uVar6;
        uVar9 = (long)iVar5 * (long)(this->P).a[2] + (long)iVar8 * (long)(this->P).a[1] +
                (long)iVar2 * (long)(this->P).a[0];
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar6 = (ulong)((int)uVar9 + 0x8000524d);
        if (uVar9 < 0x7fffadb3) {
          uVar6 = uVar9 & 0xffffffff;
        }
        uVar4 = uVar4 - 1;
        iVar5 = iVar8;
      } while (uVar4 != 0);
      (this->S).r[0] = (int)uVar6;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar8;
    }
    else {
      uVar4 = 0;
      uVar6 = uVar3;
      do {
        if ((uVar6 & 1) != 0) {
          jump2(this,uVar4);
        }
        uVar4 = uVar4 + 1;
        bVar16 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar16);
      uVar6 = (ulong)(uint)(this->S).r[0];
    }
    iVar2 = (int)uVar6;
    if (s < 0x10) {
      iVar5 = (this->S).r[1];
      iVar8 = (this->S).r[2];
      uVar4 = s;
      do {
        iVar11 = iVar5;
        iVar5 = (int)uVar6;
        uVar9 = (long)iVar8 * (long)(this->P).a[2] + (long)iVar11 * (long)(this->P).a[1] +
                (long)iVar5 * (long)(this->P).a[0];
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar6 = (ulong)((int)uVar9 + 0x8000524d);
        if (uVar9 < 0x7fffadb3) {
          uVar6 = uVar9 & 0xffffffff;
        }
        uVar4 = uVar4 - 1;
        iVar8 = iVar11;
      } while (uVar4 != 0);
      (this->S).r[0] = (int)uVar6;
      (this->S).r[1] = iVar5;
      (this->S).r[2] = iVar11;
    }
    else {
      uVar4 = 0;
      uVar6 = uVar3;
      do {
        if ((uVar6 & 1) != 0) {
          jump2(this,uVar4);
        }
        uVar4 = uVar4 + 1;
        bVar16 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar16);
      uVar6 = (ulong)(uint)(this->S).r[0];
    }
    iVar12 = (int32_t)uVar6;
    if (s < 0x10) {
      iVar5 = (this->S).r[1];
      iVar8 = (this->S).r[2];
      uVar4 = s;
      do {
        iVar11 = iVar5;
        iVar5 = (int)uVar6;
        uVar9 = (long)iVar8 * (long)(this->P).a[2] + (long)iVar11 * (long)(this->P).a[1] +
                (long)iVar5 * (long)(this->P).a[0];
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar9 = (uVar9 >> 0x1f) * -0x7fffadb3 + uVar9;
        uVar6 = (ulong)((int)uVar9 + 0x8000524d);
        if (uVar9 < 0x7fffadb3) {
          uVar6 = uVar9 & 0xffffffff;
        }
        uVar4 = uVar4 - 1;
        iVar8 = iVar11;
      } while (uVar4 != 0);
      (this->S).r[0] = (int)uVar6;
      (this->S).r[1] = iVar5;
      (this->S).r[2] = iVar11;
    }
    else {
      uVar4 = 0;
      uVar6 = uVar3;
      do {
        if ((uVar6 & 1) != 0) {
          jump2(this,uVar4);
        }
        uVar4 = uVar4 + 1;
        bVar16 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar16);
      uVar6 = (ulong)(uint)(this->S).r[0];
    }
    iVar13 = (int32_t)uVar6;
    if (s < 0x10) {
      iVar5 = (this->S).r[1];
      iVar8 = (this->S).r[2];
      do {
        iVar11 = iVar5;
        iVar5 = (int)uVar6;
        uVar3 = (long)iVar8 * (long)(this->P).a[2] + (long)iVar11 * (long)(this->P).a[1] +
                (long)iVar5 * (long)(this->P).a[0];
        uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
        uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
        uVar6 = (ulong)((int)uVar3 + 0x8000524d);
        if (uVar3 < 0x7fffadb3) {
          uVar6 = uVar3 & 0xffffffff;
        }
        local_38 = (int)uVar6;
        s = s - 1;
        iVar8 = iVar11;
      } while (s != 0);
      (this->S).r[0] = local_38;
      (this->S).r[1] = iVar5;
      (this->S).r[2] = iVar11;
    }
    else {
      uVar4 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar4);
        }
        uVar4 = uVar4 + 1;
        bVar16 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar16);
      local_38 = (this->S).r[0];
    }
    local_68 = iVar2;
    local_64 = uVar15;
    local_60 = uVar14;
    local_5c = iVar12;
    local_58 = iVar2;
    local_54 = uVar15;
    local_50 = iVar13;
    local_4c = iVar12;
    local_48 = iVar2;
    local_40 = iVar12;
    iStack_3c = iVar13;
    int_math::gauss<3>((int32_t (*) [9])&local_68,(int32_t (*) [3])&local_40,0x7fffadb3);
    *(ulong *)(this->P).a = CONCAT44(iStack_3c,local_40);
    (this->P).a[2] = local_38;
    (this->S).r[0] = iVar2;
    (this->S).r[1] = uVar15;
    (this->S).r[2] = uVar14;
    iVar2 = 3;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn3s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      int32_t a[3], b[9];
      a[0] = q3;
      b[0] = q2;
      b[1] = q1;
      b[2] = q0;
      a[1] = q4;
      b[3] = q3;
      b[4] = q2;
      b[5] = q1;
      a[2] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      int_math::gauss<3>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      S.r[0] = q2;
      S.r[1] = q1;
      S.r[2] = q0;
      for (int i{0}; i < 3; ++i)
        backward();
    }
  }